

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.cpp
# Opt level: O0

void chip8::instructions::rnd_reg_byte(registers *regs,instr_t instr)

{
  value_type vVar1;
  value_type vVar2;
  result_type_conflict1 rVar3;
  reference pvVar4;
  reference pvVar5;
  uniform_int_distribution<unsigned_short> local_13b6;
  result_type local_13b2;
  undefined1 local_13b0 [6];
  result_type random_number;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_28;
  default_random_engine engine;
  unsigned_long x_offset;
  registers *regs_local;
  instr_t instr_local;
  
  regs_local._4_2_ = instr._M_elems;
  pvVar4 = std::array<std::byte,_2UL>::operator[]
                     ((array<std::byte,_2UL> *)((long)&regs_local + 4),0);
  engine._M_x = get_lower_nibble<unsigned_long>(*pvVar4);
  std::random_device::random_device((random_device *)local_13b0);
  rVar3 = std::random_device::operator()((random_device *)local_13b0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_28,(ulong)rVar3);
  std::random_device::~random_device((random_device *)local_13b0);
  std::uniform_int_distribution<unsigned_short>::uniform_int_distribution(&local_13b6,0,0xff);
  local_13b2 = std::uniform_int_distribution<unsigned_short>::operator()(&local_13b6,&local_28);
  vVar1 = (value_type)local_13b2;
  pvVar4 = std::array<std::byte,_2UL>::operator[]
                     ((array<std::byte,_2UL> *)((long)&regs_local + 4),1);
  regs_local._6_1_ = *pvVar4;
  vVar2 = vVar1 & regs_local._6_1_;
  regs_local._7_1_ = vVar1;
  pvVar5 = std::array<std::byte,_16UL>::operator[](&regs->v,engine._M_x);
  *pvVar5 = vVar2;
  return;
}

Assistant:

void instructions::rnd_reg_byte(chip8::registers& regs, instr_t instr) noexcept
{
	const auto x_offset = instructions::get_lower_nibble<size_t>(instr[0]);

	auto engine = std::default_random_engine{std::random_device{}()};
	auto random_number = std::uniform_int_distribution<uint16_t>(0, 255)(engine);

	regs.v[x_offset] = std::byte(random_number) & instr[1];
}